

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O1

error_logger_for_timertt_t * __thiscall
so_5::timers_details::create_error_logger_for_timertt_abi_cxx11_
          (error_logger_for_timertt_t *__return_storage_ptr__,timers_details *this,
          error_logger_shptr_t *logger)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  uVar1 = *(undefined8 *)this;
  lVar2 = *(long *)(this + 8);
  if (lVar2 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    }
  }
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = uVar1;
  puVar3[1] = lVar2;
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar3;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/timers.cpp:407:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/timers.cpp:407:10)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

error_logger_for_timertt_t
create_error_logger_for_timertt( error_logger_shptr_t logger )
	{
		return [logger]( const std::string & msg ) {
			SO_5_LOG_ERROR( *logger, stream ) {
				stream << "error inside timer_thread: " << msg;
			}
		};
	}